

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
::occluded(BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  Collider CVar4;
  undefined8 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  Ray *extraout_RDX;
  Ray *extraout_RDX_00;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  uint uVar16;
  float fVar18;
  uint uVar19;
  float fVar20;
  uint uVar21;
  vint4 bi;
  undefined1 auVar17 [16];
  float fVar22;
  uint uVar23;
  float fVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  uint uVar31;
  uint uVar32;
  vint4 ai;
  float fVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  float fVar37;
  uint uVar39;
  float fVar40;
  uint uVar41;
  float fVar42;
  vint4 ai_1;
  undefined1 auVar38 [16];
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_9f4;
  Intersectors *local_9f0;
  byte *local_9e8;
  RayQueryContext *local_9e0;
  ulong local_9d8;
  Ray *local_9d0;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  long local_9b0;
  long local_9a8;
  long local_9a0;
  ulong local_998;
  ulong *local_990;
  undefined4 local_988;
  float local_984;
  float local_980;
  undefined4 local_97c;
  float local_978;
  undefined4 local_974;
  uint local_970;
  undefined4 local_96c;
  undefined4 local_968;
  int *local_958;
  undefined8 local_950;
  undefined4 *local_948;
  Intersectors *local_940;
  undefined4 *local_938;
  undefined4 local_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  float local_7e8 [4];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (local_8b8 = *(float *)&(This->intersector1).intersect, 0.0 <= local_8b8)) {
    local_9d0 = ray;
    local_990 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    local_8f8 = *(float *)&This->ptr;
    local_908 = *(float *)((long)&This->ptr + 4);
    local_8c8 = *(float *)&This->leafIntersector;
    fVar37 = *(float *)((long)&This->leafIntersector + 4);
    CVar4 = This->collider;
    local_8d8 = 0.0;
    if (0.0 <= fVar37) {
      local_8d8 = fVar37;
    }
    auVar17._4_4_ = -(uint)(ABS(CVar4.collide._4_4_) < DAT_01f80d30._4_4_);
    auVar17._0_4_ = -(uint)(ABS(CVar4.collide._0_4_) < (float)DAT_01f80d30);
    auVar17._8_4_ = -(uint)(ABS(CVar4.name._0_4_) < DAT_01f80d30._8_4_);
    auVar17._12_4_ = -(uint)(ABS(CVar4.name._4_4_) < DAT_01f80d30._12_4_);
    auVar38 = blendvps((undefined1  [16])CVar4,_DAT_01f80d30,auVar17);
    auVar17 = rcpps(auVar17,auVar38);
    local_918 = auVar17._0_4_;
    local_928 = auVar17._4_4_;
    local_8e8 = auVar17._8_4_;
    local_918 = (1.0 - auVar38._0_4_ * local_918) * local_918 + local_918;
    local_928 = (1.0 - auVar38._4_4_ * local_928) * local_928 + local_928;
    local_8e8 = (1.0 - auVar38._8_4_ * local_8e8) * local_8e8 + local_8e8;
    local_998 = (ulong)(local_918 < 0.0) << 4;
    uVar13 = (ulong)(local_928 < 0.0) << 4 | 0x20;
    uVar12 = (ulong)(local_8e8 < 0.0) << 4 | 0x40;
    uVar14 = local_998 ^ 0x10;
    local_8a8 = mm_lookupmask_ps._240_16_;
    fStack_8b4 = local_8b8;
    fStack_8b0 = local_8b8;
    fStack_8ac = local_8b8;
    fStack_8c4 = local_8c8;
    fStack_8c0 = local_8c8;
    fStack_8bc = local_8c8;
    fStack_8d4 = local_8d8;
    fStack_8d0 = local_8d8;
    fStack_8cc = local_8d8;
    fStack_8e4 = local_8e8;
    fStack_8e0 = local_8e8;
    fStack_8dc = local_8e8;
    fStack_8f4 = local_8f8;
    fStack_8f0 = local_8f8;
    fStack_8ec = local_8f8;
    fStack_904 = local_908;
    fStack_900 = local_908;
    fStack_8fc = local_908;
    fStack_914 = local_918;
    fStack_910 = local_918;
    fStack_90c = local_918;
    fStack_924 = local_928;
    fStack_920 = local_928;
    fStack_91c = local_928;
    local_9f0 = This;
    fVar37 = local_8e8;
    fVar40 = local_8e8;
    fVar42 = local_8e8;
    fVar44 = local_8e8;
    fVar48 = local_8b8;
    fVar49 = local_8b8;
    fVar50 = local_8b8;
    fVar51 = local_8b8;
    fVar53 = local_8c8;
    fVar54 = local_8c8;
    fVar55 = local_8c8;
    fVar56 = local_8c8;
    fVar57 = local_8d8;
    fVar58 = local_8d8;
    fVar59 = local_8d8;
    fVar60 = local_8d8;
    fVar61 = local_8f8;
    fVar62 = local_8f8;
    fVar63 = local_8f8;
    fVar64 = local_8f8;
    fVar47 = local_908;
    fVar52 = local_908;
    fVar82 = local_908;
    fVar68 = local_908;
    fVar69 = local_918;
    fVar70 = local_918;
    fVar71 = local_918;
    fVar72 = local_918;
    fVar73 = local_928;
    fVar74 = local_928;
    fVar45 = local_928;
    fVar46 = local_928;
LAB_00219535:
    do {
      uVar10 = local_990[-1];
      local_990 = local_990 + -1;
      local_9e0 = context;
      while ((uVar10 & 8) == 0) {
        pfVar1 = (float *)(uVar10 + 0x20 + local_998);
        fVar15 = (*pfVar1 - fVar61) * fVar69;
        fVar18 = (pfVar1[1] - fVar62) * fVar70;
        fVar20 = (pfVar1[2] - fVar63) * fVar71;
        fVar22 = (pfVar1[3] - fVar64) * fVar72;
        pfVar1 = (float *)(uVar10 + 0x20 + uVar13);
        fVar24 = (*pfVar1 - fVar47) * fVar73;
        fVar27 = (pfVar1[1] - fVar52) * fVar74;
        fVar30 = (pfVar1[2] - fVar82) * fVar45;
        fVar33 = (pfVar1[3] - fVar68) * fVar46;
        uVar25 = (uint)((int)fVar24 < (int)fVar15) * (int)fVar15 |
                 (uint)((int)fVar24 >= (int)fVar15) * (int)fVar24;
        uVar28 = (uint)((int)fVar27 < (int)fVar18) * (int)fVar18 |
                 (uint)((int)fVar27 >= (int)fVar18) * (int)fVar27;
        uVar31 = (uint)((int)fVar30 < (int)fVar20) * (int)fVar20 |
                 (uint)((int)fVar30 >= (int)fVar20) * (int)fVar30;
        uVar34 = (uint)((int)fVar33 < (int)fVar22) * (int)fVar22 |
                 (uint)((int)fVar33 >= (int)fVar22) * (int)fVar33;
        pfVar1 = (float *)(uVar10 + 0x20 + uVar12);
        fVar15 = (*pfVar1 - fVar53) * fVar37;
        fVar18 = (pfVar1[1] - fVar54) * fVar40;
        fVar20 = (pfVar1[2] - fVar55) * fVar42;
        fVar22 = (pfVar1[3] - fVar56) * fVar44;
        uVar16 = (uint)((int)fVar15 < (int)fVar57) * (int)fVar57 |
                 (uint)((int)fVar15 >= (int)fVar57) * (int)fVar15;
        uVar19 = (uint)((int)fVar18 < (int)fVar58) * (int)fVar58 |
                 (uint)((int)fVar18 >= (int)fVar58) * (int)fVar18;
        uVar21 = (uint)((int)fVar20 < (int)fVar59) * (int)fVar59 |
                 (uint)((int)fVar20 >= (int)fVar59) * (int)fVar20;
        uVar23 = (uint)((int)fVar22 < (int)fVar60) * (int)fVar60 |
                 (uint)((int)fVar22 >= (int)fVar60) * (int)fVar22;
        pfVar1 = (float *)(uVar10 + 0x20 + uVar14);
        fVar15 = (*pfVar1 - fVar61) * fVar69;
        fVar18 = (pfVar1[1] - fVar62) * fVar70;
        fVar20 = (pfVar1[2] - fVar63) * fVar71;
        fVar22 = (pfVar1[3] - fVar64) * fVar72;
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar13 ^ 0x10));
        fVar24 = (*pfVar1 - fVar47) * fVar73;
        fVar27 = (pfVar1[1] - fVar52) * fVar74;
        fVar30 = (pfVar1[2] - fVar82) * fVar45;
        fVar33 = (pfVar1[3] - fVar68) * fVar46;
        uVar36 = (uint)((int)fVar15 < (int)fVar24) * (int)fVar15 |
                 (uint)((int)fVar15 >= (int)fVar24) * (int)fVar24;
        uVar39 = (uint)((int)fVar18 < (int)fVar27) * (int)fVar18 |
                 (uint)((int)fVar18 >= (int)fVar27) * (int)fVar27;
        uVar41 = (uint)((int)fVar20 < (int)fVar30) * (int)fVar20 |
                 (uint)((int)fVar20 >= (int)fVar30) * (int)fVar30;
        uVar43 = (uint)((int)fVar22 < (int)fVar33) * (int)fVar22 |
                 (uint)((int)fVar22 >= (int)fVar33) * (int)fVar33;
        pfVar1 = (float *)(uVar10 + 0x20 + (uVar12 ^ 0x10));
        fVar15 = (*pfVar1 - fVar53) * fVar37;
        fVar18 = (pfVar1[1] - fVar54) * fVar40;
        fVar20 = (pfVar1[2] - fVar55) * fVar42;
        fVar22 = (pfVar1[3] - fVar56) * fVar44;
        uVar26 = (uint)((int)fVar48 < (int)fVar15) * (int)fVar48 |
                 (uint)((int)fVar48 >= (int)fVar15) * (int)fVar15;
        uVar29 = (uint)((int)fVar49 < (int)fVar18) * (int)fVar49 |
                 (uint)((int)fVar49 >= (int)fVar18) * (int)fVar18;
        uVar32 = (uint)((int)fVar50 < (int)fVar20) * (int)fVar50 |
                 (uint)((int)fVar50 >= (int)fVar20) * (int)fVar20;
        uVar35 = (uint)((int)fVar51 < (int)fVar22) * (int)fVar51 |
                 (uint)((int)fVar51 >= (int)fVar22) * (int)fVar22;
        auVar38._0_4_ =
             -(uint)((int)(((int)uVar36 < (int)uVar26) * uVar36 |
                          ((int)uVar36 >= (int)uVar26) * uVar26) <
                    (int)(((int)uVar16 < (int)uVar25) * uVar25 |
                         ((int)uVar16 >= (int)uVar25) * uVar16));
        auVar38._4_4_ =
             -(uint)((int)(((int)uVar39 < (int)uVar29) * uVar39 |
                          ((int)uVar39 >= (int)uVar29) * uVar29) <
                    (int)(((int)uVar19 < (int)uVar28) * uVar28 |
                         ((int)uVar19 >= (int)uVar28) * uVar19));
        auVar38._8_4_ =
             -(uint)((int)(((int)uVar41 < (int)uVar32) * uVar41 |
                          ((int)uVar41 >= (int)uVar32) * uVar32) <
                    (int)(((int)uVar21 < (int)uVar31) * uVar31 |
                         ((int)uVar21 >= (int)uVar31) * uVar21));
        auVar38._12_4_ =
             -(uint)((int)(((int)uVar43 < (int)uVar35) * uVar43 |
                          ((int)uVar43 >= (int)uVar35) * uVar35) <
                    (int)(((int)uVar23 < (int)uVar34) * uVar34 |
                         ((int)uVar23 >= (int)uVar34) * uVar23));
        uVar16 = movmskps((int)local_9e0,auVar38);
        context = (RayQueryContext *)(ulong)uVar16;
        if (uVar16 == 0xf) {
          if (local_990 == &local_7d8) {
            return;
          }
          goto LAB_00219535;
        }
        bVar11 = (byte)uVar16 ^ 0xf;
        local_9e0 = (RayQueryContext *)(ulong)bVar11;
        uVar9 = uVar10 & 0xfffffffffffffff0;
        lVar6 = 0;
        if (local_9e0 != (RayQueryContext *)0x0) {
          for (; (bVar11 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
        uVar16 = bVar11 - 1 & (uint)bVar11;
        if (uVar16 != 0) {
          *local_990 = uVar10;
          local_990 = local_990 + 1;
          lVar6 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          local_9e0 = (RayQueryContext *)(ulong)uVar16;
          if (uVar16 != 0) {
            do {
              *local_990 = uVar10;
              local_990 = local_990 + 1;
              lVar6 = 0;
              if (local_9e0 != (RayQueryContext *)0x0) {
                for (; ((ulong)local_9e0 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              uVar10 = *(ulong *)(uVar9 + lVar6 * 8);
              local_9e0 = (RayQueryContext *)
                          ((ulong)local_9e0 & (ulong)((long)&local_9e0[-1].args + 7U));
            } while (local_9e0 != (RayQueryContext *)0x0);
          }
        }
      }
      local_9a0 = (ulong)((uint)uVar10 & 0xf) - 8;
      if (local_9a0 != 0) {
        uVar9 = uVar10 & 0xfffffffffffffff0;
        local_9a8 = 0;
        do {
          local_9e0 = (RayQueryContext *)(local_9a8 * 0xb0);
          pfVar1 = (float *)((long)&local_9e0[5].user + uVar9);
          fVar37 = *pfVar1;
          fVar40 = pfVar1[1];
          fVar42 = pfVar1[2];
          fVar44 = pfVar1[3];
          pfVar1 = (float *)((long)&local_9e0[2].args + uVar9);
          fVar48 = *pfVar1;
          fVar49 = pfVar1[1];
          fVar50 = pfVar1[2];
          fVar51 = pfVar1[3];
          pfVar1 = (float *)((long)&local_9e0[4].args + uVar9);
          fVar53 = *pfVar1;
          fVar54 = pfVar1[1];
          fVar55 = pfVar1[2];
          fVar56 = pfVar1[3];
          pfVar1 = (float *)((long)&local_9e0[3].user + uVar9);
          fVar57 = *pfVar1;
          fVar58 = pfVar1[1];
          fVar59 = pfVar1[2];
          fVar60 = pfVar1[3];
          local_9c8 = fVar53 * fVar57 - fVar37 * fVar48;
          fStack_9c4 = fVar54 * fVar58 - fVar40 * fVar49;
          fStack_9c0 = fVar55 * fVar59 - fVar42 * fVar50;
          fStack_9bc = fVar56 * fVar60 - fVar44 * fVar51;
          pfVar1 = (float *)((long)&local_9e0[4].scene + uVar9);
          fVar61 = *pfVar1;
          fVar62 = pfVar1[1];
          fVar63 = pfVar1[2];
          fVar64 = pfVar1[3];
          pfVar1 = (float *)((long)&local_9e0->scene + uVar9);
          pfVar2 = (float *)((long)&local_9e0->args + uVar9);
          fVar47 = *(float *)&local_9f0->ptr;
          fVar52 = *(float *)((long)&local_9f0->ptr + 4);
          fVar82 = *(float *)&local_9f0->leafIntersector;
          fVar68 = *(float *)&(local_9f0->collider).collide;
          fVar69 = *(float *)((long)&(local_9f0->collider).collide + 4);
          fVar70 = *(float *)&(local_9f0->collider).name;
          fVar45 = *pfVar1 - fVar47;
          fVar46 = pfVar1[1] - fVar47;
          fVar15 = pfVar1[2] - fVar47;
          fVar47 = pfVar1[3] - fVar47;
          fVar18 = *pfVar2 - fVar52;
          fVar20 = pfVar2[1] - fVar52;
          fVar22 = pfVar2[2] - fVar52;
          fVar52 = pfVar2[3] - fVar52;
          fVar83 = fVar45 * fVar69 - fVar68 * fVar18;
          fVar84 = fVar46 * fVar69 - fVar68 * fVar20;
          fVar85 = fVar15 * fVar69 - fVar68 * fVar22;
          fVar86 = fVar47 * fVar69 - fVar68 * fVar52;
          pfVar1 = (float *)((long)&local_9e0[2].scene + uVar9);
          fVar71 = *pfVar1;
          fVar72 = pfVar1[1];
          fVar73 = pfVar1[2];
          fVar74 = pfVar1[3];
          local_7f8._0_4_ = fVar37 * fVar71 - fVar57 * fVar61;
          local_7f8._4_4_ = fVar40 * fVar72 - fVar58 * fVar62;
          local_7f8._8_4_ = fVar42 * fVar73 - fVar59 * fVar63;
          local_7f8._12_4_ = fVar44 * fVar74 - fVar60 * fVar64;
          pfVar1 = (float *)((long)&local_9e0[1].user + uVar9);
          fVar79 = *pfVar1 - fVar82;
          fVar80 = pfVar1[1] - fVar82;
          fVar81 = pfVar1[2] - fVar82;
          fVar82 = pfVar1[3] - fVar82;
          fVar75 = fVar68 * fVar79 - fVar45 * fVar70;
          fVar76 = fVar68 * fVar80 - fVar46 * fVar70;
          fVar77 = fVar68 * fVar81 - fVar15 * fVar70;
          fVar78 = fVar68 * fVar82 - fVar47 * fVar70;
          local_7e8[0] = fVar48 * fVar61 - fVar53 * fVar71;
          local_7e8[1] = fVar49 * fVar62 - fVar54 * fVar72;
          local_7e8[2] = fVar50 * fVar63 - fVar55 * fVar73;
          local_7e8[3] = fVar51 * fVar64 - fVar56 * fVar74;
          fVar24 = fVar70 * fVar18 - fVar69 * fVar79;
          fVar27 = fVar70 * fVar20 - fVar69 * fVar80;
          fVar30 = fVar70 * fVar22 - fVar69 * fVar81;
          fVar33 = fVar70 * fVar52 - fVar69 * fVar82;
          fVar65 = fVar69 * local_7f8._0_4_ + fVar70 * local_7e8[0] + local_9c8 * fVar68;
          fVar66 = fVar69 * local_7f8._4_4_ + fVar70 * local_7e8[1] + fStack_9c4 * fVar68;
          fVar67 = fVar69 * local_7f8._8_4_ + fVar70 * local_7e8[2] + fStack_9c0 * fVar68;
          fVar68 = fVar69 * local_7f8._12_4_ + fVar70 * local_7e8[3] + fStack_9bc * fVar68;
          uVar19 = (uint)fVar65 & 0x80000000;
          uVar21 = (uint)fVar66 & 0x80000000;
          uVar23 = (uint)fVar67 & 0x80000000;
          uVar25 = (uint)fVar68 & 0x80000000;
          local_898._0_4_ =
               (float)((uint)(fVar61 * fVar24 + fVar53 * fVar75 + fVar37 * fVar83) ^ uVar19);
          local_898._4_4_ =
               (float)((uint)(fVar62 * fVar27 + fVar54 * fVar76 + fVar40 * fVar84) ^ uVar21);
          local_898._8_4_ =
               (float)((uint)(fVar63 * fVar30 + fVar55 * fVar77 + fVar42 * fVar85) ^ uVar23);
          local_898._12_4_ =
               (float)((uint)(fVar64 * fVar33 + fVar56 * fVar78 + fVar44 * fVar86) ^ uVar25);
          local_888 = (float)((uint)(fVar24 * fVar71 + fVar75 * fVar48 + fVar83 * fVar57) ^ uVar19);
          fStack_884 = (float)((uint)(fVar27 * fVar72 + fVar76 * fVar49 + fVar84 * fVar58) ^ uVar21)
          ;
          fStack_880 = (float)((uint)(fVar30 * fVar73 + fVar77 * fVar50 + fVar85 * fVar59) ^ uVar23)
          ;
          fStack_87c = (float)((uint)(fVar33 * fVar74 + fVar78 * fVar51 + fVar86 * fVar60) ^ uVar25)
          ;
          local_868 = ABS(fVar65);
          fStack_864 = ABS(fVar66);
          fStack_860 = ABS(fVar67);
          fStack_85c = ABS(fVar68);
          uVar26 = -(uint)(local_898._0_4_ + local_888 <= local_868) &
                   -(uint)((0.0 <= local_888 && 0.0 <= local_898._0_4_) && fVar65 != 0.0) &
                   local_8a8._0_4_;
          uVar28 = -(uint)(local_898._4_4_ + fStack_884 <= fStack_864) &
                   -(uint)((0.0 <= fStack_884 && 0.0 <= local_898._4_4_) && fVar66 != 0.0) &
                   local_8a8._4_4_;
          uVar29 = -(uint)(local_898._8_4_ + fStack_880 <= fStack_860) &
                   -(uint)((0.0 <= fStack_880 && 0.0 <= local_898._8_4_) && fVar67 != 0.0) &
                   local_8a8._8_4_;
          uVar31 = -(uint)(local_898._12_4_ + fStack_87c <= fStack_85c) &
                   -(uint)((0.0 <= fStack_87c && 0.0 <= local_898._12_4_) && fVar68 != 0.0) &
                   local_8a8._12_4_;
          auVar8._4_4_ = uVar28;
          auVar8._0_4_ = uVar26;
          auVar8._8_4_ = uVar29;
          auVar8._12_4_ = uVar31;
          uVar16 = movmskps((int)uVar10,auVar8);
          uVar10 = (ulong)uVar16;
          if (uVar16 != 0) {
            local_878 = (float)(uVar19 ^ (uint)(fVar45 * local_9c8 +
                                               fVar18 * local_7f8._0_4_ + fVar79 * local_7e8[0]));
            fStack_874 = (float)(uVar21 ^ (uint)(fVar46 * fStack_9c4 +
                                                fVar20 * local_7f8._4_4_ + fVar80 * local_7e8[1]));
            fStack_870 = (float)(uVar23 ^ (uint)(fVar15 * fStack_9c0 +
                                                fVar22 * local_7f8._8_4_ + fVar81 * local_7e8[2]));
            fStack_86c = (float)(uVar25 ^ (uint)(fVar47 * fStack_9bc +
                                                fVar52 * local_7f8._12_4_ + fVar82 * local_7e8[3]));
            fVar37 = *(float *)((long)&local_9f0->leafIntersector + 4);
            fVar40 = *(float *)&(local_9f0->intersector1).intersect;
            local_848._0_4_ =
                 -(uint)(fVar37 * local_868 < local_878 && local_878 <= fVar40 * local_868) & uVar26
            ;
            local_848._4_4_ =
                 -(uint)(fVar37 * fStack_864 < fStack_874 && fStack_874 <= fVar40 * fStack_864) &
                 uVar28;
            local_848._8_4_ =
                 -(uint)(fVar37 * fStack_860 < fStack_870 && fStack_870 <= fVar40 * fStack_860) &
                 uVar29;
            local_848._12_4_ =
                 -(uint)(fVar37 * fStack_85c < fStack_86c && fStack_86c <= fVar40 * fStack_85c) &
                 uVar31;
            uVar16 = movmskps((int)ray,local_848);
            ray = (Ray *)(ulong)uVar16;
            if (uVar16 != 0) {
              local_808._4_4_ = fStack_9c4;
              local_808._0_4_ = local_9c8;
              local_808._8_4_ = fStack_9c0;
              local_808._12_4_ = fStack_9bc;
              uVar5 = *(undefined8 *)&(local_9d0->org).field_0;
              local_9c8 = (float)uVar5;
              fStack_9c4 = (float)((ulong)uVar5 >> 0x20);
              auVar7._4_4_ = fStack_864;
              auVar7._0_4_ = local_868;
              auVar7._8_4_ = fStack_860;
              auVar7._12_4_ = fStack_85c;
              auVar17 = rcpps(local_808,auVar7);
              fVar37 = auVar17._0_4_;
              fVar40 = auVar17._4_4_;
              fVar42 = auVar17._8_4_;
              fVar44 = auVar17._12_4_;
              fVar37 = (1.0 - local_868 * fVar37) * fVar37 + fVar37;
              fVar40 = (1.0 - fStack_864 * fVar40) * fVar40 + fVar40;
              fVar42 = (1.0 - fStack_860 * fVar42) * fVar42 + fVar42;
              fVar44 = (1.0 - fStack_85c * fVar44) * fVar44 + fVar44;
              local_818[0] = local_878 * fVar37;
              local_818[1] = fStack_874 * fVar40;
              local_818[2] = fStack_870 * fVar42;
              local_818[3] = fStack_86c * fVar44;
              local_838._0_4_ = local_898._0_4_ * fVar37;
              local_838._4_4_ = local_898._4_4_ * fVar40;
              local_838._8_4_ = local_898._8_4_ * fVar42;
              local_838._12_4_ = local_898._12_4_ * fVar44;
              local_828._0_4_ = fVar37 * local_888;
              local_828._4_4_ = fVar40 * fStack_884;
              local_828._8_4_ = fVar42 * fStack_880;
              local_828._12_4_ = fVar44 * fStack_87c;
              local_9d8 = (ulong)ray & 0xff;
              local_9e0 = (RayQueryContext *)((long)&local_9e0->scene + uVar9);
              do {
                uVar10 = 0;
                if (local_9d8 != 0) {
                  for (; (local_9d8 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                  }
                }
                local_970 = *(uint *)((long)&local_9e0[6].scene + uVar10 * 4);
                ray = (Ray *)(ulong)local_970;
                local_9b0 = *(long *)(*(long *)(CONCAT44(fStack_9c4,local_9c8) + 0x1e8) +
                                     (long)ray * 8);
                if ((*(uint *)(local_9b0 + 0x34) &
                    *(uint *)((long)&(local_9f0->intersector1).intersect + 4)) == 0) {
                  local_9d8 = local_9d8 ^ 1L << (uVar10 & 0x3f);
                }
                else {
                  local_9e8 = *(byte **)&(local_9d0->dir).field_0;
                  if ((*(long *)(local_9e8 + 0x10) == 0) && (*(long *)(local_9b0 + 0x48) == 0)) {
LAB_00219b5e:
                    *(undefined4 *)&(local_9f0->intersector1).intersect = 0xff800000;
                    return;
                  }
                  local_948 = *(undefined4 **)((long)&(local_9d0->org).field_0 + 8);
                  local_988 = *(undefined4 *)(local_808 + uVar10 * 4);
                  local_984 = local_7e8[uVar10 - 4];
                  local_980 = local_7e8[uVar10];
                  local_97c = *(undefined4 *)(local_838 + uVar10 * 4);
                  local_978 = local_818[uVar10 - 4];
                  local_974 = *(undefined4 *)((long)&local_9e0[6].args + uVar10 * 4);
                  local_96c = *local_948;
                  local_968 = local_948[1];
                  uVar3 = *(undefined4 *)&(local_9f0->intersector1).intersect;
                  *(float *)&(local_9f0->intersector1).intersect = local_818[uVar10];
                  local_9f4 = -1;
                  local_958 = &local_9f4;
                  local_950 = *(undefined8 *)(local_9b0 + 0x18);
                  local_938 = &local_988;
                  local_930 = 1;
                  local_940 = local_9f0;
                  if (((*(code **)(local_9b0 + 0x48) == (code *)0x0) ||
                      ((**(code **)(local_9b0 + 0x48))(&local_958), ray = extraout_RDX,
                      *local_958 != 0)) &&
                     ((*(code **)(local_9e8 + 0x10) == (code *)0x0 ||
                      ((((*local_9e8 & 2) == 0 && ((*(byte *)(local_9b0 + 0x3e) & 0x40) == 0)) ||
                       ((**(code **)(local_9e8 + 0x10))(&local_958), ray = extraout_RDX_00,
                       *local_958 != 0)))))) goto LAB_00219b5e;
                  *(undefined4 *)&(local_9f0->intersector1).intersect = uVar3;
                  local_9d8 = local_9d8 ^ 1L << (uVar10 & 0x3f);
                }
              } while (local_9d8 != 0);
              uVar10 = 0;
            }
          }
          local_9a8 = local_9a8 + 1;
        } while (local_9a8 != local_9a0);
      }
      context = local_9e0;
      fVar37 = local_8e8;
      fVar40 = fStack_8e4;
      fVar42 = fStack_8e0;
      fVar44 = fStack_8dc;
      fVar48 = local_8b8;
      fVar49 = fStack_8b4;
      fVar50 = fStack_8b0;
      fVar51 = fStack_8ac;
      fVar53 = local_8c8;
      fVar54 = fStack_8c4;
      fVar55 = fStack_8c0;
      fVar56 = fStack_8bc;
      fVar57 = local_8d8;
      fVar58 = fStack_8d4;
      fVar59 = fStack_8d0;
      fVar60 = fStack_8cc;
      fVar61 = local_8f8;
      fVar62 = fStack_8f4;
      fVar63 = fStack_8f0;
      fVar64 = fStack_8ec;
      fVar47 = local_908;
      fVar52 = fStack_904;
      fVar82 = fStack_900;
      fVar68 = fStack_8fc;
      fVar69 = local_918;
      fVar70 = fStack_914;
      fVar71 = fStack_910;
      fVar72 = fStack_90c;
      fVar73 = local_928;
      fVar74 = fStack_924;
      fVar45 = fStack_920;
      fVar46 = fStack_91c;
    } while (local_990 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }